

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O0

vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
* __thiscall
cmLocalGenerator::GetTargetCompileFlags
          (vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *__return_storage_ptr__,cmLocalGenerator *this,cmGeneratorTarget *target,string *config,
          string *lang,string *arch)

{
  bool bVar1;
  ulong uVar2;
  string local_d8;
  string local_b8;
  string local_98 [48];
  cmMakefile *local_68;
  cmMakefile *mf;
  string compileFlags;
  string *arch_local;
  string *lang_local;
  string *config_local;
  cmGeneratorTarget *target_local;
  cmLocalGenerator *this_local;
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *flags;
  
  compileFlags.field_2._M_local_buf[0xf] = '\0';
  std::
  vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector(__return_storage_ptr__);
  std::__cxx11::string::string((string *)&mf);
  local_68 = GetMakefile(this);
  AddLanguageFlags(this,(string *)&mf,target,Compile,lang,config);
  bVar1 = cmGeneratorTarget::IsIPOEnabled(target,lang,config);
  if (bVar1) {
    AppendFeatureOptions(this,(string *)&mf,lang,"IPO");
  }
  AddArchitectureFlags(this,(string *)&mf,target,lang,config,arch);
  bVar1 = std::operator==(lang,"Fortran");
  if (bVar1) {
    (*this->_vptr_cmLocalGenerator[0xf])(local_98,this,target,config);
    (*this->_vptr_cmLocalGenerator[6])(this,&mf,local_98);
    std::__cxx11::string::~string(local_98);
  }
  AddCMP0018Flags(this,(string *)&mf,target,lang,config);
  AddVisibilityPresetFlags(this,(string *)&mf,target,lang);
  AddColorDiagnosticsFlags(this,(string *)&mf,lang);
  cmMakefile::GetDefineFlags_abi_cxx11_(&local_b8,local_68);
  (*this->_vptr_cmLocalGenerator[6])(this,&mf,&local_b8);
  std::__cxx11::string::~string((string *)&local_b8);
  GetFrameworkFlags(&local_d8,this,lang,config,target);
  (*this->_vptr_cmLocalGenerator[6])(this,&mf,&local_d8);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    std::vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>>::
    emplace_back<std::__cxx11::string>
              ((vector<BT<std::__cxx11::string>,std::allocator<BT<std::__cxx11::string>>> *)
               __return_storage_ptr__,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&mf);
  }
  AddCompileOptions(this,__return_storage_ptr__,target,lang,config);
  compileFlags.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&mf);
  if ((compileFlags.field_2._M_local_buf[0xf] & 1U) == 0) {
    std::
    vector<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<BT<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<BT<std::string>> cmLocalGenerator::GetTargetCompileFlags(
  cmGeneratorTarget* target, std::string const& config,
  std::string const& lang, std::string const& arch)
{
  std::vector<BT<std::string>> flags;
  std::string compileFlags;

  cmMakefile* mf = this->GetMakefile();

  // Add language-specific flags.
  this->AddLanguageFlags(compileFlags, target, cmBuildStep::Compile, lang,
                         config);

  if (target->IsIPOEnabled(lang, config)) {
    this->AppendFeatureOptions(compileFlags, lang, "IPO");
  }

  this->AddArchitectureFlags(compileFlags, target, lang, config, arch);

  if (lang == "Fortran") {
    this->AppendFlags(compileFlags,
                      this->GetTargetFortranFlags(target, config));
  }

  this->AddCMP0018Flags(compileFlags, target, lang, config);
  this->AddVisibilityPresetFlags(compileFlags, target, lang);
  this->AddColorDiagnosticsFlags(compileFlags, lang);
  this->AppendFlags(compileFlags, mf->GetDefineFlags());
  this->AppendFlags(compileFlags,
                    this->GetFrameworkFlags(lang, config, target));

  if (!compileFlags.empty()) {
    flags.emplace_back(std::move(compileFlags));
  }
  this->AddCompileOptions(flags, target, lang, config);
  return flags;
}